

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  bool bVar1;
  ImU32 col_00;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ImVec4 *in_RDI;
  int in_R8D;
  long in_R9;
  float fVar2;
  ImVec2 IVar3;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect image_bb;
  ImRect bb;
  ImVec2 padding;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  ImDrawCornerFlags in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  ImVec4 *in_stack_fffffffffffffee0;
  ImRect *in_stack_fffffffffffffee8;
  ImVec2 *pIVar4;
  ImGuiWindow *in_stack_fffffffffffffef0;
  ImVec2 *uv_min;
  ImRect *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff08;
  ImDrawList *in_stack_ffffffffffffff10;
  bool *in_stack_ffffffffffffff18;
  ImGuiID in_stack_ffffffffffffff24;
  ImRect *bb_00;
  float rounding;
  ImVec2 local_a4;
  ImVec2 local_9c;
  undefined1 local_94 [12];
  float in_stack_ffffffffffffff78;
  float fVar5;
  float fVar6;
  ImVec2 local_74;
  ImRect local_6c;
  ImVec2 local_5c;
  ImGuiID local_54;
  ImGuiStyle *local_50;
  ImGuiContext *local_48;
  ImGuiWindow *local_40;
  long local_38;
  int local_2c;
  ImVec2 *local_28;
  ImVec2 *local_20;
  ImVec4 *local_10;
  bool local_1;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    local_48 = GImGui;
    local_50 = &GImGui->Style;
    PushID(in_stack_fffffffffffffee0);
    local_54 = ImGuiWindow::GetID(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                                  (char *)in_stack_fffffffffffffee0);
    PopID();
    if (local_2c < 0) {
      local_5c = local_50->FramePadding;
    }
    else {
      ImVec2::ImVec2(&local_5c,(float)local_2c,(float)local_2c);
    }
    bb_00 = (ImRect *)&local_40->DC;
    IVar3 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (ImVec2 *)0x232ea3);
    fVar6 = IVar3.x;
    pIVar4 = &local_5c;
    IVar3 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0.0)
    ;
    fVar2 = IVar3.x;
    fVar5 = IVar3.y;
    local_74 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           (ImVec2 *)0x232ee4);
    ImRect::ImRect(&local_6c,&bb_00->Min,&local_74);
    local_9c = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           (ImVec2 *)0x232f20);
    ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                (ImVec2 *)0x232f42);
    local_a4 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           (ImVec2 *)0x232f60);
    ImRect::ImRect((ImRect *)local_94,&local_9c,&local_a4);
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
    bVar1 = ItemAdd(in_stack_fffffffffffffef8,(ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                    in_stack_fffffffffffffee8);
    if (bVar1) {
      bVar1 = ButtonBehavior(bb_00,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                             (bool *)in_stack_ffffffffffffff10,
                             (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      rounding = (float)((ulong)bb_00 >> 0x20);
      col_00 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                           SUB84(in_stack_fffffffffffffee0,0));
      RenderNavHighlight((ImRect *)CONCAT44(fVar6,fVar5),(ImGuiID)fVar2,
                         (ImGuiNavHighlightFlags)in_stack_ffffffffffffff78);
      fVar2 = ImMin<float>(local_5c.x,local_5c.y);
      ImClamp<float>(fVar2,0.0,local_50->FrameRounding);
      RenderFrame(local_6c.Min,local_6c.Max,(ImU32)((ulong)pIVar4 >> 0x20),
                  SUB81((ulong)pIVar4 >> 0x18,0),rounding);
      if (0.0 < *(float *)(local_38 + 0xc)) {
        in_stack_ffffffffffffff08 = local_40->DrawList;
        in_stack_ffffffffffffff10 = (ImDrawList *)local_94;
        GetColorU32(in_stack_fffffffffffffee0);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->Min,
                   (ImVec2 *)in_stack_fffffffffffffee0,
                   (ImU32)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (float)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      }
      pIVar4 = (ImVec2 *)local_94;
      uv_min = (ImVec2 *)(local_94 + 8);
      GetColorU32(local_10);
      ImDrawList::AddImage
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,local_28,local_20,uv_min,pIVar4
                 ,col_00);
      local_1 = bVar1;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    // We could hash the size/uv to create a unique ID but that would prevent the user from animating UV.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    const ImVec2 padding = (frame_padding >= 0) ? ImVec2((float)frame_padding, (float)frame_padding) : style.FramePadding;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    const ImRect image_bb(window->DC.CursorPos + padding, window->DC.CursorPos + padding + size);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(image_bb.Min, image_bb.Max, GetColorU32(bg_col));
    window->DrawList->AddImage(user_texture_id, image_bb.Min, image_bb.Max, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}